

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-view.c
# Opt level: O1

_Bool borg_update_view_aux(wchar_t y,wchar_t x,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2)

{
  uint16_t *puVar1;
  borg_grid *pbVar2;
  _Bool _Var3;
  _Bool _Var4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  borg_grid *ag;
  borg_grid *ag_00;
  byte bVar10;
  
  ag_00 = borg_grids[y1] + x1;
  ag = borg_grids[y2] + x2;
  _Var3 = borg_cave_floor_grid(ag_00);
  _Var4 = borg_cave_floor_grid(ag);
  bVar5 = true;
  if (_Var3 || _Var4) {
    if (_Var3) {
      bVar8 = ((byte)ag_00->info & 0x20) >> 5;
    }
    else {
      bVar8 = 0;
    }
    if (_Var4) {
      bVar10 = ((byte)ag->info & 0x20) >> 5;
    }
    else {
      bVar10 = 0;
    }
    if (bVar8 != 0 || bVar10 != 0) {
      pbVar2 = borg_grids[y];
      _Var3 = borg_cave_floor_grid(pbVar2 + x);
      if (bVar8 == 0) {
        bVar6 = 0;
      }
      else {
        bVar6 = (byte)ag_00->info >> 7;
      }
      if (bVar10 == 0) {
        bVar7 = 0;
      }
      else {
        bVar7 = (byte)ag->info >> 7;
      }
      if (bVar6 == 0) {
        bVar5 = (bool)(bVar8 & bVar10 & _Var3 ^ 1);
        uVar9 = 0x20;
        if (((bVar8 & bVar10) == 0) && (uVar9 = 0x20, _Var3)) {
          _Var3 = borg_los(borg.c.y,borg.c.x,y,x);
          if (!_Var3) {
            return true;
          }
          bVar5 = false;
        }
      }
      else {
        bVar5 = !_Var3;
        uVar9 = (ushort)(bVar6 & bVar7) << 7 | 0x20;
      }
      puVar1 = &pbVar2[x].info;
      *puVar1 = *puVar1 | uVar9;
      borg_view_y[borg_view_n] = (uint8_t)y;
      borg_view_x[borg_view_n] = (uint8_t)x;
      borg_view_n = borg_view_n + 1;
    }
  }
  return bVar5;
}

Assistant:

static bool borg_update_view_aux(int y, int x, int y1, int x1, int y2, int x2)
{
    bool f1, f2, v1, v2, vis1, vis2, wall;

    borg_grid *ag;

    borg_grid *g1_ag;
    borg_grid *g2_ag;

    /* Access the grids */
    g1_ag = &borg_grids[y1][x1];
    g2_ag = &borg_grids[y2][x2];

    /* Check for walls */
    f1 = (borg_cave_floor_grid(g1_ag));
    f2 = (borg_cave_floor_grid(g2_ag));

    /* Totally blocked by physical walls */
    if (!f1 && !f2)
        return true;

    /* Check for visibility */
    v1 = (f1 && (g1_ag->info & BORG_VIEW));
    v2 = (f2 && (g2_ag->info & BORG_VIEW));

    /* Totally blocked by "unviewable neighbors" */
    if (!v1 && !v2)
        return true;

    /* Access the grid */
    ag = &borg_grids[y][x];

    /* Check for walls */
    wall = (!borg_cave_floor_grid(ag));

    /* Check the "ease" of visibility */
    vis1 = (v1 && (g1_ag->info & BORG_XTRA));
    vis2 = (v2 && (g2_ag->info & BORG_XTRA));

    /* Hack -- "easy" plus "easy" yields "easy" */
    if (vis1 && vis2) {
        ag->info |= BORG_XTRA;

        borg_cave_view_hack(ag, y, x);

        return wall;
    }

    /* Hack -- primary "easy" yields "viewed" */
    if (vis1) {
        borg_cave_view_hack(ag, y, x);

        return wall;
    }

    /* Hack -- "view" plus "view" yields "view" */
    if (v1 && v2) {
        /* ag->info |= BORG_XTRA; */

        borg_cave_view_hack(ag, y, x);

        return wall;
    }

    /* Mega-Hack -- the "borg_los()" function works poorly on walls */
    if (wall) {
        borg_cave_view_hack(ag, y, x);

        return wall;
    }

    /* Hack -- check line of sight */
    if (borg_los(borg.c.y, borg.c.x, y, x)) {
        borg_cave_view_hack(ag, y, x);

        return wall;
    }

    /* Assume no line of sight. */
    return true;
}